

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simpleformatter.h
# Opt level: O0

UnicodeString * __thiscall
icu_63::SimpleFormatter::getTextWithNoArguments
          (UnicodeString *__return_storage_ptr__,SimpleFormatter *this)

{
  int32_t compiledPatternLength;
  char16_t *compiledPattern;
  SimpleFormatter *this_local;
  
  compiledPattern = UnicodeString::getBuffer(&this->compiledPattern);
  compiledPatternLength = UnicodeString::length(&this->compiledPattern);
  getTextWithNoArguments(__return_storage_ptr__,compiledPattern,compiledPatternLength);
  return __return_storage_ptr__;
}

Assistant:

UnicodeString getTextWithNoArguments() const {
        return getTextWithNoArguments(compiledPattern.getBuffer(), compiledPattern.length());
    }